

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-crypt.c
# Opt level: O1

int ldesdecode(lua_State *L)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  char *s;
  undefined4 *puVar5;
  size_t textsz;
  uint32_t SK [32];
  uint32_t ESK [32];
  uint8_t tmp [256];
  size_t local_230;
  uint32_t local_228 [2];
  undefined4 auStack_220 [30];
  uint32_t local_1a8 [30];
  undefined4 local_130 [2];
  char local_128 [256];
  
  des_key(L,local_1a8);
  uVar3 = 0xfffffffffffffffe;
  puVar5 = local_130 + 1;
  do {
    auStack_220[uVar3] = puVar5[-1];
    auStack_220[uVar3 + 1] = *puVar5;
    uVar3 = uVar3 + 2;
    puVar5 = puVar5 + -2;
  } while (uVar3 < 0x1e);
  local_230 = 0;
  pcVar4 = luaL_checklstring(L,2,&local_230);
  if (local_230 == 0 || (local_230 & 7) != 0) {
    iVar1 = luaL_error(L,"Invalid des crypt text length %d");
  }
  else {
    if (local_230 < 0x101) {
      s = local_128;
    }
    else {
      s = (char *)lua_newuserdata(L,local_230);
    }
    if (local_230 != 0) {
      uVar3 = 0;
      do {
        des_crypt(local_228,(uint8_t *)(pcVar4 + uVar3),(uint8_t *)(s + uVar3));
        uVar3 = uVar3 + 8;
      } while (uVar3 < local_230);
    }
    uVar3 = (ulong)((int)local_230 + -1);
    uVar2 = 1;
    if (local_230 - 8 <= uVar3) {
      iVar1 = (int)local_230 + -2;
      do {
        if (s[uVar3] != '\0') {
          if (s[uVar3] != -0x80) goto LAB_0011d2dd;
          break;
        }
        uVar2 = uVar2 + 1;
        uVar3 = (ulong)iVar1;
        iVar1 = iVar1 + -1;
      } while (local_230 - 8 <= uVar3);
    }
    if (uVar2 < 9) {
      lua_pushlstring(L,s,local_230 - uVar2);
      iVar1 = 1;
    }
    else {
LAB_0011d2dd:
      iVar1 = luaL_error(L,"Invalid des crypt text");
    }
  }
  return iVar1;
}

Assistant:

static int
ldesdecode(lua_State *L) {
	uint32_t ESK[32];
	des_key(L, ESK);
	uint32_t SK[32];
	int i;
	for( i = 0; i < 32; i += 2 ) {
		SK[i] = ESK[30 - i];
		SK[i + 1] = ESK[31 - i];
	}
	size_t textsz = 0;
	const uint8_t *text = (const uint8_t *)luaL_checklstring(L, 2, &textsz);
	if ((textsz & 7) || textsz == 0) {
		return luaL_error(L, "Invalid des crypt text length %d", (int)textsz);
	}
	uint8_t tmp[SMALL_CHUNK];
	uint8_t *buffer = tmp;
	if (textsz > SMALL_CHUNK) {
		buffer = lua_newuserdata(L, textsz);
	}
	for (i=0;i<textsz;i+=8) {
		des_crypt(SK, text+i, buffer+i);
	}
	int padding = 1;
	for (i=textsz-1;i>=textsz-8;i--) {
		if (buffer[i] == 0) {
			padding++;
		} else if (buffer[i] == 0x80) {
			break;
		} else {
			return luaL_error(L, "Invalid des crypt text");
		}
	}
	if (padding > 8) {
		return luaL_error(L, "Invalid des crypt text");
	}
	lua_pushlstring(L, (const char *)buffer, textsz - padding);
	return 1;
}